

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas2.cxx
# Opt level: O2

void HBLAS2::hblas2_gemv_square_LDSame<std::complex<double>,HAXX::quaternion<double>,(char)78>(void)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  quaternion<double> BETA_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined8 uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  ostream *poVar10;
  basic_ostream<char,_std::char_traits<char>_> *pbVar11;
  long lVar12;
  quaternion<double> *x;
  pointer pqVar13;
  pointer pqVar14;
  undefined1 auVar15 [16];
  result_type_conflict1 in_XMM0_Qa;
  result_type_conflict1 rVar16;
  result_type_conflict1 rVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  result_type_conflict1 in_XMM1_Qa;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  complex<double> ALPHA_00;
  undefined4 in_stack_fffffffffffffc6c;
  quaternion<double> *in_stack_fffffffffffffc70;
  int32_t in_stack_fffffffffffffc78;
  undefined4 uVar24;
  undefined4 uStack_384;
  complex<double> ALPHA;
  quaternion<double> local_350;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> Y;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> X;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> A;
  undefined1 local_2c8 [8];
  undefined8 local_2c0;
  shared_count sStack_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> YC;
  undefined **local_258;
  undefined1 local_250;
  undefined8 *local_248;
  char **local_240;
  quaternion<double> BETA;
  quaternion<double> local_218;
  quaternion<double> __r;
  quaternion<double> local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&A,10000,(allocator_type *)&ss);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&X,100,(allocator_type *)&ss);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&Y,100,(allocator_type *)&ss);
  for (pqVar14 = X.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pqVar13 = Y.
                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
      pqVar14 !=
      X.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish; pqVar14 = pqVar14 + 1) {
    in_XMM1_Qa = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar16 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar17 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    in_stack_fffffffffffffc78 = SUB84(rVar17,0);
    uStack_384 = (undefined4)((ulong)rVar17 >> 0x20);
    in_XMM0_Qa = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    pqVar14->_M_real = in_XMM1_Qa;
    pqVar14->_M_imag_i = rVar16;
    pqVar14->_M_imag_j = (double)CONCAT44(uStack_384,in_stack_fffffffffffffc78);
    pqVar14->_M_imag_k = in_XMM0_Qa;
  }
  for (; pqVar14 = A.
                   super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
      pqVar13 !=
      Y.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish; pqVar13 = pqVar13 + 1) {
    in_XMM1_Qa = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar16 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar17 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    in_stack_fffffffffffffc78 = SUB84(rVar17,0);
    uStack_384 = (undefined4)((ulong)rVar17 >> 0x20);
    in_XMM0_Qa = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    pqVar13->_M_real = in_XMM1_Qa;
    pqVar13->_M_imag_i = rVar16;
    pqVar13->_M_imag_j = (double)CONCAT44(uStack_384,in_stack_fffffffffffffc78);
    pqVar13->_M_imag_k = in_XMM0_Qa;
  }
  for (; pqVar14 !=
         A.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
         _M_impl.super__Vector_impl_data._M_finish; pqVar14 = pqVar14 + 1) {
    in_XMM1_Qa = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar16 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar17 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    in_stack_fffffffffffffc78 = SUB84(rVar17,0);
    uStack_384 = (undefined4)((ulong)rVar17 >> 0x20);
    in_XMM0_Qa = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    pqVar14->_M_real = in_XMM1_Qa;
    pqVar14->_M_imag_i = rVar16;
    pqVar14->_M_imag_j = (double)CONCAT44(uStack_384,in_stack_fffffffffffffc78);
    pqVar14->_M_imag_k = in_XMM0_Qa;
  }
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector(&YC,&Y);
  genRandom<std::complex<double>>();
  ALPHA._M_value._0_8_ = in_XMM0_Qa;
  ALPHA._M_value._8_8_ = in_XMM1_Qa;
  genRandom<HAXX::quaternion<double>>();
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar10 = std::operator<<(local_1a8,"hblas2_gemv_square_");
  std::operator<<(poVar10,'N');
  std::operator<<(local_1a8,"C");
  std::operator<<(local_1a8,"Q");
  std::operator<<(local_1a8,"_LDSame");
  std::__cxx11::stringbuf::str();
  poVar10 = std::operator<<((ostream *)&std::cout,(string *)&local_350);
  poVar10 = std::operator<<(poVar10," will use");
  std::endl<char,std::char_traits<char>>(poVar10);
  std::__cxx11::string::~string((string *)&local_350);
  poVar10 = std::operator<<((ostream *)&std::cout,"  ALPHA = ");
  poVar10 = std::operator<<(poVar10,(complex *)&ALPHA);
  std::endl<char,std::char_traits<char>>(poVar10);
  poVar10 = std::operator<<((ostream *)&std::cout,"  BETA = ");
  pbVar11 = HAXX::operator<<(poVar10,&BETA);
  std::endl<char,std::char_traits<char>>(pbVar11);
  BETA_00._M_imag_i = BETA._M_imag_k;
  BETA_00._M_real = BETA._M_imag_j;
  BETA_00._M_imag_j =
       (double)Y.
               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  BETA_00._M_imag_k._0_4_ = 1;
  BETA_00._M_imag_k._4_4_ = in_stack_fffffffffffffc6c;
  ALPHA_00._M_value._8_8_ = 100;
  ALPHA_00._M_value._0_8_ =
       A.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  HAXX::
  HBLAS_GEMV<double,HAXX::quaternion<double>,HAXX::quaternion<double>,std::complex<double>,HAXX::quaternion<double>>
            ('N',100,100,ALPHA_00,
             X.
             super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start,1,(quaternion<double> *)BETA._M_real,
             BETA._M_imag_i._0_4_,BETA_00,in_stack_fffffffffffffc70,in_stack_fffffffffffffc78);
  for (lVar12 = 0; lVar12 != 0xc80; lVar12 = lVar12 + 0x20) {
    HAXX::HBLAS_DOTUV<double>
              (&local_350,100,
               (quaternion<double> *)
               ((long)&(A.
                        super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar12),100,
               X.
               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start,1);
    dVar9 = local_350._M_imag_k;
    dVar8 = local_350._M_imag_j;
    dVar7 = local_350._M_imag_i;
    dVar6 = local_350._M_real;
    local_290 = &boost::unit_test::basic_cstring<char_const>::null;
    local_288 = &boost::unit_test::basic_cstring<char_const>::null;
    local_280 = 
    "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx";
    local_278 = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x47,&local_290);
    uVar5 = ALPHA._M_value._0_8_;
    uVar24 = ALPHA._M_value._8_4_;
    uStack_384 = ALPHA._M_value._12_4_;
    HAXX::operator*(&local_218,&BETA,
                    (quaternion<double> *)
                    ((long)&(YC.
                             super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar12));
    auVar3._4_4_ = uStack_384;
    auVar3._0_4_ = uVar24;
    auVar3._8_8_ = 0;
    auVar4._8_8_ = dVar7;
    auVar4._0_8_ = dVar6;
    auVar4._16_8_ = dVar8;
    auVar4._24_8_ = dVar9;
    auVar23._8_8_ = uVar5;
    auVar23._0_8_ = uVar5;
    auVar23._16_8_ = uVar5;
    auVar23._24_8_ = uVar5;
    auVar15._8_8_ = 0x8000000000000000;
    auVar15._0_8_ = 0x8000000000000000;
    auVar15 = vxorpd_avx512vl(auVar3,auVar15);
    auVar15 = vunpcklpd_avx(auVar15,auVar3);
    auVar1 = vshufpd_avx(auVar4,auVar4,5);
    auVar2 = vpermpd_avx2(ZEXT1632(auVar15),0x44);
    auVar19._0_8_ = auVar1._0_8_ * auVar2._0_8_;
    auVar19._8_8_ = auVar1._8_8_ * auVar2._8_8_;
    auVar19._16_8_ = auVar1._16_8_ * auVar2._16_8_;
    auVar19._24_8_ = auVar1._24_8_ * auVar2._24_8_;
    auVar15 = vfmadd213pd_fma(auVar23,auVar4,auVar19);
    __r._M_real = auVar15._0_8_ + local_218._M_real;
    __r._M_imag_i = auVar15._8_8_ + local_218._M_imag_i;
    __r._M_imag_j = local_218._M_imag_j + 0.0;
    __r._M_imag_k = local_218._M_imag_k + 0.0;
    HAXX::inv<double>(&local_1d8,
                      (quaternion<double> *)
                      ((long)&(Y.
                               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar12));
    HAXX::operator*(&local_350,&__r,&local_1d8);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_350._M_imag_i;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = local_350._M_imag_j;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = local_350._M_imag_k;
    local_250 = 0;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = (local_350._M_real + -1.0) * (local_350._M_real + -1.0);
    auVar15 = vfmadd231sd_fma(auVar22,auVar18,auVar18);
    auVar15 = vfmadd231sd_fma(auVar15,auVar20,auVar20);
    auVar15 = vfmadd231sd_fma(auVar15,auVar21,auVar21);
    auVar15 = vsqrtsd_avx(auVar15,auVar15);
    local_2c8[0] = auVar15._0_8_ < 1e-12;
    local_2c0 = 0;
    sStack_2b8.pi_ = (sp_counted_base *)0x0;
    local_2a0 = "( HAXX::norm(((ALPHA*tmp + BETA*YC[i]) * HAXX::inv(Y[i]))- 1.) < 1e-12 )";
    local_298 = "";
    local_258 = &PTR__lazy_ostream_00219908;
    local_248 = &boost::unit_test::lazy_ostream::inst;
    local_240 = &local_2a0;
    local_2b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx";
    local_2a8 = "";
    boost::test_tools::tt_detail::report_assertion(local_2c8,&local_258,&local_2b0,0x47,1,0,0);
    boost::detail::shared_count::~shared_count(&sStack_2b8);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&YC.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&Y.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&X.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&A.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  return;
}

Assistant:

void hblas2_gemv_square_LDSame() {

  // Random Quaternion vectors and matricies
  std::vector<HAXX::quaternion<double>> 
    A(HBLAS2_MATLEN), X(HBLAS1_VECLEN), Y(HBLAS1_VECLEN);

  for(auto &x : X) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : Y) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : A) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));

  std::vector<HAXX::quaternion<double>> YC(Y);

  _AlphaF ALPHA = genRandom<_AlphaF>();
  _BetaF  BETA = genRandom<_BetaF>();

  std::stringstream ss;

  ss << "hblas2_gemv_square_" << _TA;
  if(std::is_same<double,_AlphaF>::value) ss << "R";
  else if(std::is_same<std::complex<double>,_AlphaF>::value) ss << "C";
  else ss << "Q";
  if(std::is_same<double,_BetaF>::value) ss << "R";
  else if(std::is_same<std::complex<double>,_BetaF>::value) ss << "C";
  else ss << "Q";
  ss << "_LDSame";

  std::cout << ss.str() << " will use" << std::endl;
  std::cout << "  ALPHA = " << ALPHA << std::endl;
  std::cout << "  BETA = " << BETA << std::endl;

  HBLAS_GEMV(_TA,HBLAS1_VECLEN,HBLAS1_VECLEN,ALPHA,&A[0],HBLAS1_VECLEN,&X[0],1,
    BETA,&Y[0],1);

  for(int i = 0; i < HBLAS1_VECLEN; i++) {
    HAXX_INT AROW = 0;
    HAXX_INT ACOL = i;
    HAXX_INT AStride = 1;
    if( _TA == 'N' ) {
      AROW = i;
      ACOL = 0;
      AStride = HBLAS1_VECLEN;
    }

    HAXX::quaternion<double> tmp;
    if( _TA == 'C' )
      tmp = HBLAS_DOTCV(HBLAS1_VECLEN,&A[RANK2_INDX(AROW,ACOL,HBLAS1_VECLEN)],
          AStride,&X[0],1);
    else
      tmp = HBLAS_DOTUV(HBLAS1_VECLEN,&A[RANK2_INDX(AROW,ACOL,HBLAS1_VECLEN)],
          AStride,&X[0],1);

    BOOST_CHECK(CMP_Q(ALPHA*tmp + BETA*YC[i],Y[i]));
  }

}